

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                  void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                  float scale_max,ImVec2 frame_size)

{
  ImVec2 *p;
  ImU32 IVar1;
  void *pvVar2;
  bool bVar3;
  ImGuiID id;
  ImU32 IVar4;
  ImU32 IVar5;
  uint uVar6;
  int iVar7;
  ImGuiContext *pIVar8;
  int iVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImVec2 IVar15;
  ImVec2 pos;
  undefined1 extraout_var [12];
  float fVar16;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar17;
  float fVar18;
  float fVar19;
  float local_128;
  ImVec2 local_110;
  undefined1 local_108 [8];
  undefined4 uStack_100;
  undefined4 uStack_fc;
  ImVec2 local_f8;
  undefined8 uStack_f0;
  ImGuiContext *local_e0;
  ImGuiWindow *local_d8;
  void *local_d0;
  float local_c8;
  ImVec2 pos0;
  ImRect inner_bb;
  ImRect frame_bb;
  ImRect total_bb;
  
  pIVar8 = GImGui;
  local_d8 = GImGui->CurrentWindow;
  local_d8->WriteAccessed = true;
  if (local_d8->SkipItems == false) {
    uStack_100 = in_XMM2_Dc;
    local_108 = (undefined1  [8])frame_size;
    uStack_fc = in_XMM2_Dd;
    local_d0 = data;
    local_c8 = scale_max;
    id = ImGuiWindow::GetID(local_d8,label,(char *)0x0);
    IVar15 = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar11 = (float)local_108._0_4_;
    if (((float)local_108._0_4_ == 0.0) && (!NAN((float)local_108._0_4_))) {
      fVar11 = CalcItemWidth();
    }
    fVar12 = IVar15.x;
    if (((float)local_108._4_4_ != 0.0) || (NAN((float)local_108._4_4_))) {
      fVar13 = (pIVar8->Style).FramePadding.y;
    }
    else {
      fVar13 = (pIVar8->Style).FramePadding.y;
      local_108._4_4_ = fVar13 + fVar13 + IVar15.y;
    }
    frame_bb.Min.x = (local_d8->DC).CursorPos.x;
    frame_bb.Min.y = (local_d8->DC).CursorPos.y;
    local_108._0_4_ = fVar11;
    frame_bb.Max.x = fVar11 + frame_bb.Min.x;
    frame_bb.Max.y = (float)local_108._4_4_ + frame_bb.Min.y;
    fVar11 = (pIVar8->Style).FramePadding.x;
    inner_bb.Min.x = fVar11 + frame_bb.Min.x;
    inner_bb.Min.y = frame_bb.Min.y + fVar13;
    inner_bb.Max.x = frame_bb.Max.x - fVar11;
    inner_bb.Max.y = frame_bb.Max.y - fVar13;
    fVar11 = 0.0;
    if (0.0 < fVar12) {
      fVar11 = (pIVar8->Style).ItemInnerSpacing.x + fVar12;
    }
    total_bb.Max.x = frame_bb.Max.x + fVar11;
    total_bb.Max.y = frame_bb.Max.y + 0.0;
    local_e0 = pIVar8;
    total_bb.Min.x = frame_bb.Min.x;
    total_bb.Min.y = frame_bb.Min.y;
    ItemSize(&total_bb,fVar13);
    pIVar8 = local_e0;
    bVar3 = ItemAdd(&total_bb,0,&frame_bb);
    if (bVar3) {
      bVar3 = ItemHoverable(&frame_bb,id);
      if (((scale_min == 3.4028235e+38) && (!NAN(scale_min))) ||
         ((local_128 = scale_min, local_c8 == 3.4028235e+38 && (!NAN(local_c8))))) {
        iVar7 = 0;
        iVar9 = 0;
        if (0 < values_count) {
          iVar9 = values_count;
        }
        fVar11 = 3.4028235e+38;
        local_f8.x = -3.4028235e+38;
        local_f8.y = 0.0;
        uStack_f0._0_4_ = 0;
        uStack_f0._4_4_ = 0;
        for (; iVar9 != iVar7; iVar7 = iVar7 + 1) {
          fVar13 = (*values_getter)(local_d0,iVar7);
          if (!NAN(fVar13)) {
            if (fVar13 <= fVar11) {
              fVar11 = fVar13;
            }
            local_f8.y = (float)((uint)local_f8.y & extraout_var._0_4_);
            uStack_f0._0_4_ = (uint)uStack_f0 & extraout_var._4_4_;
            uStack_f0._4_4_ = uStack_f0._4_4_ & extraout_var._8_4_;
            local_f8.x = (float)((uint)local_f8.x & -(uint)(fVar13 <= local_f8.x) |
                                ~-(uint)(fVar13 <= local_f8.x) & (uint)fVar13);
          }
        }
        local_128 = (float)(~-(uint)(scale_min == 3.4028235e+38) & (uint)scale_min |
                           (uint)fVar11 & -(uint)(scale_min == 3.4028235e+38));
        local_c8 = (float)(~-(uint)(local_c8 == 3.4028235e+38) & (uint)local_c8 |
                          (uint)local_f8.x & -(uint)(local_c8 == 3.4028235e+38));
        pIVar8 = local_e0;
      }
      local_f8.y = frame_bb.Min.y;
      local_f8.x = frame_bb.Min.x;
      uStack_f0 = 0;
      IVar15.y = frame_bb.Max.y;
      IVar15.x = frame_bb.Max.x;
      IVar4 = GetColorU32(7,1.0);
      RenderFrame(local_f8,IVar15,IVar4,true,(pIVar8->Style).FrameRounding);
      if ((int)((plot_type == ImGuiPlotType_Lines) + 1) <= values_count) {
        iVar9 = (int)(float)local_108._0_4_;
        if (values_count <= (int)(float)local_108._0_4_) {
          iVar9 = values_count;
        }
        local_f8.x = (float)(values_count - (uint)(plot_type == ImGuiPlotType_Lines));
        uVar6 = 0xffffffff;
        if (bVar3) {
          p = &(local_e0->IO).MousePos;
          bVar3 = ImRect::Contains(&inner_bb,p);
          pvVar2 = local_d0;
          if (bVar3) {
            fVar13 = (p->x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x);
            fVar11 = 0.9999;
            if (fVar13 <= 0.9999) {
              fVar11 = fVar13;
            }
            uVar6 = (uint)((float)(int)local_f8.x * (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar11));
            if (((int)uVar6 < 0) || (values_count <= (int)uVar6)) {
              __assert_fail("v_idx >= 0 && v_idx < values_count",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/src/imgui_widgets.cpp"
                            ,0x169d,
                            "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                           );
            }
            fVar11 = (*values_getter)(local_d0,(int)(values_offset + uVar6) % values_count);
            local_108._0_4_ = fVar11;
            (*values_getter)(pvVar2,(int)(values_offset + uVar6 + 1) % values_count);
            if (plot_type == ImGuiPlotType_Lines) {
              SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)uVar6,(ulong)(uVar6 + 1));
            }
            else if (plot_type == ImGuiPlotType_Histogram) {
              SetTooltip("%d: %8.4g",(double)(float)local_108._0_4_,(ulong)uVar6);
            }
          }
        }
        iVar9 = iVar9 - (uint)(plot_type == ImGuiPlotType_Lines);
        _local_108 = ZEXT416(~-(uint)(local_128 == local_c8) & (uint)(1.0 / (local_c8 - local_128)))
        ;
        fVar11 = (*values_getter)(local_d0,values_offset % values_count);
        fVar13 = (fVar11 - local_128) * (float)local_108._0_4_;
        fVar11 = 1.0;
        if (fVar13 <= 1.0) {
          fVar11 = fVar13;
        }
        if (0.0 <= local_c8 * local_128) {
          fVar14 = (float)(~-(uint)(local_128 < 0.0) & 0x3f800000);
        }
        else {
          fVar14 = -local_128 * (float)local_108._0_4_;
        }
        IVar4 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x26,1.0);
        IVar5 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x27,1.0);
        local_c8 = (float)(int)local_f8.x;
        iVar7 = 0;
        if (0 < iVar9) {
          iVar7 = iVar9;
        }
        fVar17 = 0.0;
        fVar11 = (float)(-(uint)(fVar13 < 0.0) & 0x3f800000 |
                        ~-(uint)(fVar13 < 0.0) & (uint)(1.0 - fVar11));
        while (bVar3 = iVar7 != 0, iVar7 = iVar7 + -1, bVar3) {
          uVar10 = (uint)(fVar17 * local_c8 + 0.5);
          if (((int)uVar10 < 0) || (values_count <= (int)uVar10)) {
            __assert_fail("v1_idx >= 0 && v1_idx < values_count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/src/imgui_widgets.cpp"
                          ,0x16b7,
                          "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                         );
          }
          local_f8.y = 0.0;
          local_f8.x = 1.0 / (float)iVar9 + fVar17;
          uStack_f0 = 0;
          fVar13 = (*values_getter)(local_d0,(int)(values_offset + 1 + uVar10) % values_count);
          fVar18 = (fVar13 - local_128) * (float)local_108._0_4_;
          fVar13 = 1.0;
          if (fVar18 <= 1.0) {
            fVar13 = fVar18;
          }
          fVar19 = (float)(-(uint)(fVar18 < 0.0) & 0x3f800000 |
                          ~-(uint)(fVar18 < 0.0) & (uint)(1.0 - fVar13));
          fVar16 = inner_bb.Min.x;
          local_110.y = inner_bb.Min.y;
          fVar13 = inner_bb.Max.x - fVar16;
          fVar18 = inner_bb.Max.y - local_110.y;
          fVar17 = fVar17 * fVar13 + fVar16;
          pos0.y = fVar11 * fVar18 + local_110.y;
          pos0.x = fVar17;
          local_110.x = fVar13 * local_f8.x + fVar16;
          if (plot_type == ImGuiPlotType_Lines) {
            local_110.y = fVar18 * fVar19 + local_110.y;
            IVar1 = IVar4;
            if (uVar6 == uVar10) {
              IVar1 = IVar5;
            }
            ImDrawList::AddLine(local_d8->DrawList,&pos0,&local_110,IVar1,1.0);
          }
          else {
            local_110.y = fVar18 * fVar14 + local_110.y;
            if (plot_type == ImGuiPlotType_Histogram) {
              if (fVar17 + 2.0 <= local_110.x) {
                local_110.x = local_110.x + -1.0;
              }
              IVar1 = IVar4;
              if (uVar6 == uVar10) {
                IVar1 = IVar5;
              }
              ImDrawList::AddRectFilled(local_d8->DrawList,&pos0,&local_110,IVar1,0.0,0xf);
            }
          }
          fVar17 = local_f8.x;
          fVar11 = fVar19;
        }
      }
      pIVar8 = local_e0;
      if (overlay_text != (char *)0x0) {
        pos0.y = frame_bb.Min.y + (local_e0->Style).FramePadding.y;
        pos0.x = frame_bb.Min.x;
        local_110.x = 0.5;
        local_110.y = 0.0;
        RenderTextClipped(&pos0,&frame_bb.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_110,
                          (ImRect *)0x0);
      }
      if (0.0 < fVar12) {
        pos.x = frame_bb.Max.x + (pIVar8->Style).ItemInnerSpacing.x;
        pos.y = inner_bb.Min.y;
        RenderText(pos,label,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

void ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 frame_size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (frame_size.x == 0.0f)
        frame_size.x = CalcItemWidth();
    if (frame_size.y == 0.0f)
        frame_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return;
    const bool hovered = ItemHoverable(frame_bb, id);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            if (v != v) // Ignore NaN values
                continue;
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const int values_count_min = (plot_type == ImGuiPlotType_Lines) ? 2 : 1;
    if (values_count >= values_count_min)
    {
        int res_w = ImMin((int)frame_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        int v_hovered = -1;
        if (hovered && inner_bb.Contains(g.IO.MousePos))
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx+1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            v_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (-scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f,0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);
}